

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O2

CURLcode Curl_dyn_setlen(dynbuf *s,size_t set)

{
  if (s->leng < set) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  s->leng = set;
  s->bufr[set] = '\0';
  return CURLE_OK;
}

Assistant:

CURLcode Curl_dyn_setlen(struct dynbuf *s, size_t set)
{
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  if(set > s->leng)
    return CURLE_BAD_FUNCTION_ARGUMENT;
  s->leng = set;
  s->bufr[s->leng] = 0;
  return CURLE_OK;
}